

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

Token * __thiscall lexer::Lexer::NextToken(Token *__return_storage_ptr__,Lexer *this)

{
  char cVar1;
  bool bVar2;
  int v;
  pointer ppVar3;
  allocator<char> local_c29;
  string local_c28;
  Token local_c08;
  string local_bd8;
  Word local_bb8;
  undefined1 local_b68 [8];
  string literal_6;
  string local_b10;
  int local_af0;
  undefined4 local_aec;
  int val;
  Word local_ac8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_token::Token>,_true>
  local_a78;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_token::Token>,_true>
  local_a70;
  iterator wsrch;
  string literal_5;
  string local_a40;
  Token local_a20;
  allocator<char> local_9e9;
  string local_9e8;
  Symbol local_9c8;
  allocator<char> local_971;
  string local_970;
  Symbol local_950;
  allocator<char> local_8f9;
  string local_8f8;
  Symbol local_8d8;
  allocator<char> local_881;
  string local_880;
  Symbol local_860;
  allocator<char> local_809;
  string local_808;
  Symbol local_7e8;
  allocator<char> local_791;
  string local_790;
  Operator local_770;
  string local_720;
  Operator local_700;
  allocator<char> local_6a9;
  undefined1 local_6a8 [8];
  string literal_4;
  undefined1 local_680 [6];
  char ch_4;
  Operator local_660;
  string local_610;
  Operator local_5f0;
  allocator<char> local_599;
  undefined1 local_598 [8];
  string literal_3;
  undefined1 local_570 [6];
  char ch_3;
  Operator local_550;
  string local_500;
  Operator local_4e0;
  allocator<char> local_489;
  undefined1 local_488 [8];
  string literal_2;
  undefined1 local_460 [6];
  char ch_2;
  Operator local_440;
  string local_3f0;
  Operator local_3d0;
  allocator<char> local_379;
  undefined1 local_378 [8];
  string literal_1;
  undefined1 local_350 [6];
  char ch_1;
  Operator local_330;
  allocator<char> local_2d9;
  string local_2d8;
  Operator local_2b8;
  allocator<char> local_261;
  string local_260;
  Operator local_240;
  allocator<char> local_1e9;
  string local_1e8;
  Operator local_1c8;
  allocator<char> local_171;
  string local_170;
  Symbol local_150;
  allocator<char> local_f9;
  string local_f8;
  Token local_d8;
  string local_a8;
  Token local_88;
  allocator<char> local_51;
  undefined1 local_50 [8];
  string literal;
  char ch;
  Lexer *this_local;
  Token *tok;
  
  token::Token::Token(__return_storage_ptr__);
  skipWhiteSpace(this);
  switch(this->curChar) {
  case '\0':
    cVar1 = this->curChar;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a40,1,cVar1,
               (allocator<char> *)(literal_5.field_2._M_local_buf + 0xf));
    token::Token::Token(&local_a20,EOB,&local_a40);
    token::Token::operator=(__return_storage_ptr__,&local_a20);
    token::Token::~Token(&local_a20);
    std::__cxx11::string::~string((string *)&local_a40);
    std::allocator<char>::~allocator((allocator<char> *)(literal_5.field_2._M_local_buf + 0xf));
    break;
  default:
    bVar2 = isLetter(this,this->curChar);
    if (bVar2) {
      readIdent_abi_cxx11_((string *)&wsrch,this);
      local_a70._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_token::Token,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_token::Token>_>_>
           ::find(&keywords_abi_cxx11_,(key_type *)&wsrch);
      local_a78._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_token::Token,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_token::Token>_>_>
           ::end(&keywords_abi_cxx11_);
      bVar2 = std::__detail::operator==(&local_a70,&local_a78);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        std::__cxx11::string::string
                  ((string *)&val,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wsrch);
        Word::Word(&local_ac8,ID,(string *)&val);
        token::Token::operator=(__return_storage_ptr__,&local_ac8.super_Token);
        Word::~Word(&local_ac8);
        std::__cxx11::string::~string((string *)&val);
      }
      else {
        ppVar3 = std::__detail::
                 _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_token::Token>,_false,_true>
                 ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_token::Token>,_false,_true>
                               *)&local_a70);
        token::Token::operator=(__return_storage_ptr__,&ppVar3->second);
      }
      local_aec = 1;
      std::__cxx11::string::~string((string *)&wsrch);
      return __return_storage_ptr__;
    }
    bVar2 = isDigit(this,this->curChar);
    if (bVar2) {
      readInt_abi_cxx11_(&local_b10,this);
      v = std::__cxx11::stoi(&local_b10,(size_t *)0x0,10);
      std::__cxx11::string::~string((string *)&local_b10);
      local_af0 = v;
      Num::Num((Num *)((long)&literal_6.field_2 + 8),v);
      token::Token::operator=(__return_storage_ptr__,(Token *)((long)&literal_6.field_2 + 8));
      Num::~Num((Num *)((long)&literal_6.field_2 + 8));
      return __return_storage_ptr__;
    }
    if ((this->curChar == '\'') || (this->curChar == '\"')) {
      readStringLiteral_abi_cxx11_((string *)local_b68,this,this->curChar);
      std::__cxx11::string::string
                ((string *)&local_bd8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b68);
      Word::Word(&local_bb8,LITERAL,&local_bd8);
      token::Token::operator=(__return_storage_ptr__,&local_bb8.super_Token);
      Word::~Word(&local_bb8);
      std::__cxx11::string::~string((string *)&local_bd8);
      std::__cxx11::string::~string((string *)local_b68);
    }
    else {
      cVar1 = this->curChar;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_c28,1,cVar1,&local_c29);
      token::Token::Token(&local_c08,INVALID,&local_c28);
      token::Token::operator=(__return_storage_ptr__,&local_c08);
      token::Token::~Token(&local_c08);
      std::__cxx11::string::~string((string *)&local_c28);
      std::allocator<char>::~allocator(&local_c29);
    }
    break;
  case '\n':
    cVar1 = this->curChar;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,1,cVar1,&local_171);
    Symbol::Symbol(&local_150,NEWLINE,&local_170);
    token::Token::operator=(__return_storage_ptr__,&local_150.super_Token);
    Symbol::~Symbol(&local_150);
    std::__cxx11::string::~string((string *)&local_170);
    std::allocator<char>::~allocator(&local_171);
    this->line = this->line + 1;
    break;
  case '!':
    cVar1 = peekChar(this);
    if (cVar1 == '=') {
      literal_4.field_2._M_local_buf[0xe] = this->curChar;
      readChar(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_6a8,"",&local_6a9);
      std::allocator<char>::~allocator(&local_6a9);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6a8,
                 literal_4.field_2._M_local_buf[0xe]);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6a8,
                 this->curChar);
      std::__cxx11::string::string
                ((string *)&local_720,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6a8);
      Operator::Operator(&local_700,NOT_EQ,&local_720);
      token::Token::operator=(__return_storage_ptr__,&local_700.super_Token);
      Operator::~Operator(&local_700);
      std::__cxx11::string::~string((string *)&local_720);
      std::__cxx11::string::~string((string *)local_6a8);
    }
    else {
      cVar1 = this->curChar;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_790,1,cVar1,&local_791);
      Operator::Operator(&local_770,BANG,&local_790);
      token::Token::operator=(__return_storage_ptr__,&local_770.super_Token);
      Operator::~Operator(&local_770);
      std::__cxx11::string::~string((string *)&local_790);
      std::allocator<char>::~allocator(&local_791);
    }
    break;
  case '(':
    cVar1 = this->curChar;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_970,1,cVar1,&local_971);
    Symbol::Symbol(&local_950,LPAREN,&local_970);
    token::Token::operator=(__return_storage_ptr__,&local_950.super_Token);
    Symbol::~Symbol(&local_950);
    std::__cxx11::string::~string((string *)&local_970);
    std::allocator<char>::~allocator(&local_971);
    break;
  case ')':
    cVar1 = this->curChar;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_9e8,1,cVar1,&local_9e9);
    Symbol::Symbol(&local_9c8,RPAREN,&local_9e8);
    token::Token::operator=(__return_storage_ptr__,&local_9c8.super_Token);
    Symbol::~Symbol(&local_9c8);
    std::__cxx11::string::~string((string *)&local_9e8);
    std::allocator<char>::~allocator(&local_9e9);
    break;
  case '*':
    cVar1 = this->curChar;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d8,1,cVar1,&local_2d9);
    Operator::Operator(&local_2b8,ASTERISK,&local_2d8);
    token::Token::operator=(__return_storage_ptr__,&local_2b8.super_Token);
    Operator::~Operator(&local_2b8);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::allocator<char>::~allocator(&local_2d9);
    break;
  case '+':
    cVar1 = this->curChar;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,1,cVar1,&local_1e9);
    Operator::Operator(&local_1c8,PLUS,&local_1e8);
    token::Token::operator=(__return_storage_ptr__,&local_1c8.super_Token);
    Operator::~Operator(&local_1c8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::allocator<char>::~allocator(&local_1e9);
    break;
  case ',':
    cVar1 = this->curChar;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_808,1,cVar1,&local_809);
    Symbol::Symbol(&local_7e8,COMMA,&local_808);
    token::Token::operator=(__return_storage_ptr__,&local_7e8.super_Token);
    Symbol::~Symbol(&local_7e8);
    std::__cxx11::string::~string((string *)&local_808);
    std::allocator<char>::~allocator(&local_809);
    break;
  case '-':
    cVar1 = this->curChar;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,1,cVar1,&local_261);
    Operator::Operator(&local_240,MINUS,&local_260);
    token::Token::operator=(__return_storage_ptr__,&local_240.super_Token);
    Operator::~Operator(&local_240);
    std::__cxx11::string::~string((string *)&local_260);
    std::allocator<char>::~allocator(&local_261);
    break;
  case '.':
    cVar1 = peekChar(this);
    if (cVar1 == '.') {
      literal.field_2._M_local_buf[0xb] = this->curChar;
      readChar(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_50,"",&local_51);
      std::allocator<char>::~allocator(&local_51);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                 literal.field_2._M_local_buf[0xb]);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                 this->curChar);
      std::__cxx11::string::string
                ((string *)&local_a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
      token::Token::Token(&local_88,RANGE,&local_a8);
      token::Token::operator=(__return_storage_ptr__,&local_88);
      token::Token::~Token(&local_88);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)local_50);
    }
    else {
      cVar1 = this->curChar;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,1,cVar1,&local_f9);
      token::Token::Token(&local_d8,INVALID,&local_f8);
      token::Token::operator=(__return_storage_ptr__,&local_d8);
      token::Token::~Token(&local_d8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::allocator<char>::~allocator(&local_f9);
    }
    break;
  case '/':
    cVar1 = this->curChar;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_350,1,cVar1,(allocator<char> *)(literal_1.field_2._M_local_buf + 0xf)
              );
    Operator::Operator(&local_330,DIV,(string *)local_350);
    token::Token::operator=(__return_storage_ptr__,&local_330.super_Token);
    Operator::~Operator(&local_330);
    std::__cxx11::string::~string((string *)local_350);
    std::allocator<char>::~allocator((allocator<char> *)(literal_1.field_2._M_local_buf + 0xf));
    break;
  case '<':
    cVar1 = peekChar(this);
    if (cVar1 == '=') {
      literal_1.field_2._M_local_buf[0xe] = this->curChar;
      readChar(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_378,"",&local_379);
      std::allocator<char>::~allocator(&local_379);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378,
                 literal_1.field_2._M_local_buf[0xe]);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378,
                 this->curChar);
      std::__cxx11::string::string
                ((string *)&local_3f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378);
      Operator::Operator(&local_3d0,LT_EQ,&local_3f0);
      token::Token::operator=(__return_storage_ptr__,&local_3d0.super_Token);
      Operator::~Operator(&local_3d0);
      std::__cxx11::string::~string((string *)&local_3f0);
      std::__cxx11::string::~string((string *)local_378);
    }
    else {
      cVar1 = this->curChar;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_460,1,cVar1,
                 (allocator<char> *)(literal_2.field_2._M_local_buf + 0xf));
      Operator::Operator(&local_440,LT,(string *)local_460);
      token::Token::operator=(__return_storage_ptr__,&local_440.super_Token);
      Operator::~Operator(&local_440);
      std::__cxx11::string::~string((string *)local_460);
      std::allocator<char>::~allocator((allocator<char> *)(literal_2.field_2._M_local_buf + 0xf));
    }
    break;
  case '=':
    cVar1 = peekChar(this);
    if (cVar1 == '=') {
      literal_3.field_2._M_local_buf[0xe] = this->curChar;
      readChar(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_598,"",&local_599);
      std::allocator<char>::~allocator(&local_599);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_598,
                 literal_3.field_2._M_local_buf[0xe]);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_598,
                 this->curChar);
      std::__cxx11::string::string
                ((string *)&local_610,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_598);
      Operator::Operator(&local_5f0,EQ,&local_610);
      token::Token::operator=(__return_storage_ptr__,&local_5f0.super_Token);
      Operator::~Operator(&local_5f0);
      std::__cxx11::string::~string((string *)&local_610);
      std::__cxx11::string::~string((string *)local_598);
    }
    else {
      cVar1 = this->curChar;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_680,1,cVar1,
                 (allocator<char> *)(literal_4.field_2._M_local_buf + 0xf));
      Operator::Operator(&local_660,ASSIGN,(string *)local_680);
      token::Token::operator=(__return_storage_ptr__,&local_660.super_Token);
      Operator::~Operator(&local_660);
      std::__cxx11::string::~string((string *)local_680);
      std::allocator<char>::~allocator((allocator<char> *)(literal_4.field_2._M_local_buf + 0xf));
    }
    break;
  case '>':
    cVar1 = peekChar(this);
    if (cVar1 == '=') {
      literal_2.field_2._M_local_buf[0xe] = this->curChar;
      readChar(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_488,"",&local_489);
      std::allocator<char>::~allocator(&local_489);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_488,
                 literal_2.field_2._M_local_buf[0xe]);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_488,
                 this->curChar);
      std::__cxx11::string::string
                ((string *)&local_500,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_488);
      Operator::Operator(&local_4e0,GT_EQ,&local_500);
      token::Token::operator=(__return_storage_ptr__,&local_4e0.super_Token);
      Operator::~Operator(&local_4e0);
      std::__cxx11::string::~string((string *)&local_500);
      std::__cxx11::string::~string((string *)local_488);
    }
    else {
      cVar1 = this->curChar;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_570,1,cVar1,
                 (allocator<char> *)(literal_3.field_2._M_local_buf + 0xf));
      Operator::Operator(&local_550,GT,(string *)local_570);
      token::Token::operator=(__return_storage_ptr__,&local_550.super_Token);
      Operator::~Operator(&local_550);
      std::__cxx11::string::~string((string *)local_570);
      std::allocator<char>::~allocator((allocator<char> *)(literal_3.field_2._M_local_buf + 0xf));
    }
    break;
  case '{':
    cVar1 = this->curChar;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_880,1,cVar1,&local_881);
    Symbol::Symbol(&local_860,LBRACE,&local_880);
    token::Token::operator=(__return_storage_ptr__,&local_860.super_Token);
    Symbol::~Symbol(&local_860);
    std::__cxx11::string::~string((string *)&local_880);
    std::allocator<char>::~allocator(&local_881);
    break;
  case '}':
    cVar1 = this->curChar;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_8f8,1,cVar1,&local_8f9);
    Symbol::Symbol(&local_8d8,RBRACE,&local_8f8);
    token::Token::operator=(__return_storage_ptr__,&local_8d8.super_Token);
    Symbol::~Symbol(&local_8d8);
    std::__cxx11::string::~string((string *)&local_8f8);
    std::allocator<char>::~allocator(&local_8f9);
  }
  readChar(this);
  return __return_storage_ptr__;
}

Assistant:

Token Lexer::NextToken()
{
    Token tok;
    skipWhiteSpace();

    switch (curChar) {
    case '.':
        if (peekChar() == '.'){
            char ch = curChar;
            readChar();
            std::string literal = "";
            literal += ch;
            literal += curChar;
            tok = Token(TokenType::RANGE, literal);
        }else{
            tok = Token(TokenType::INVALID, std::string(1, curChar));
        }
        break;
    case '\n':
        tok = Symbol(TokenType::NEWLINE, std::string(1, curChar));
        line++;
        break;
    case '+':
        tok = Operator(TokenType::PLUS, std::string(1, curChar));
        break;
    case '-':
        tok = Operator(TokenType::MINUS, std::string(1, curChar));
        break;
    case '*':
        tok = Operator(TokenType::ASTERISK, std::string(1, curChar));
        break;
    case '/':
        tok = Operator(TokenType::DIV, std::string(1, curChar));
        break;
    case '<':
        if (peekChar() == '='){
            char ch = curChar;
            readChar();
            std::string literal = "";
            literal += ch;
            literal += curChar;
            tok = Operator(TokenType::LT_EQ, literal);
        }else{
            tok = Operator(TokenType::LT, std::string(1, curChar));
        }
        break;
    case '>':
        if (peekChar() == '='){
            char ch = curChar;
            readChar();
            std::string literal = "";
            literal += ch;
            literal += curChar;
            tok = Operator(TokenType::GT_EQ, literal);
        }else{
            tok = Operator(TokenType::GT, std::string(1, curChar));
        }

        break;
    case '=':
        if (peekChar() == '='){
            char ch = curChar;
            readChar();
            std::string literal = "";
            literal += ch;
            literal += curChar;
            tok = Operator(TokenType::EQ, literal);
        }else{
            tok = Operator(TokenType::ASSIGN, std::string(1, curChar));
        }
        break;
    case '!':
        if (peekChar() == '='){
            char ch = curChar;
            readChar();
            std::string literal = "";
            literal += ch;
            literal += curChar;
            tok = Operator(TokenType::NOT_EQ, literal);
        }else{
            tok = Operator(TokenType::BANG, std::string(1, curChar));
        }
        break;
    case ',':
        tok = Symbol(TokenType::COMMA, std::string(1, curChar));
        break;
    case '{':
        tok = Symbol(TokenType::LBRACE, std::string(1, curChar));
        break;
    case '}':
        tok = Symbol(TokenType::RBRACE, std::string(1, curChar));
        break;
    case '(':
        tok = Symbol(TokenType::LPAREN, std::string(1, curChar));
        break;
    case ')':
        tok = Symbol(TokenType::RPAREN, std::string(1, curChar));
        break;
    case '\0':
        tok = Token(TokenType::EOB, std::string(1, curChar));
        break;
    default:
        if (isLetter(curChar)){
            std::string literal = readIdent();
            auto wsrch = Lexer::keywords.find(literal);
            if(wsrch != Lexer::keywords.end())
                tok  = wsrch->second;
            else
                tok = Word(TokenType::ID, literal);
            return tok;
        }else if (isDigit(curChar)){
            int val = std::stoi(readInt());
            tok = Num(val);
            return tok;
        }else if(curChar == '\'' || curChar == '"'){
            std::string literal = readStringLiteral(curChar);
            tok = Word(TokenType::LITERAL, literal);
        }
        else{
           tok = Token(TokenType::INVALID, std::string(1, curChar));
        }

    }
    readChar();
    return tok;
}